

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int setDateTimeToCurrent(sqlite3_context *context,DateTime *p)

{
  int iVar1;
  sqlite3 *psVar2;
  sqlite3 *db;
  DateTime *p_local;
  sqlite3_context *context_local;
  
  psVar2 = sqlite3_context_db_handle(context);
  iVar1 = sqlite3OsCurrentTimeInt64(psVar2->pVfs,&p->iJD);
  if (iVar1 == 0) {
    p->validJD = '\x01';
  }
  context_local._4_4_ = (uint)(iVar1 != 0);
  return context_local._4_4_;
}

Assistant:

static int setDateTimeToCurrent(sqlite3_context *context, DateTime *p){
  sqlite3 *db = sqlite3_context_db_handle(context);
  if( sqlite3OsCurrentTimeInt64(db->pVfs, &p->iJD)==SQLITE_OK ){
    p->validJD = 1;
    return 0;
  }else{
    return 1;
  }
}